

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::Underwater_Acoustic_PDU
          (Underwater_Acoustic_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  Underwater_Acoustic_PDU *this_local;
  
  Header7::Header7(&this->super_Header,H);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Underwater_Acoustic_PDU_00331cb0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EmittingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EventID);
  std::vector<KDIS::DATA_TYPE::Shaft,_std::allocator<KDIS::DATA_TYPE::Shaft>_>::vector
            (&this->m_vShafts);
  std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::vector(&this->m_vAPA);
  std::
  vector<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem>_>
  ::vector(&this->m_vUAES);
  (*(this->super_Header).super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

Underwater_Acoustic_PDU::Underwater_Acoustic_PDU(const Header &H, KDataStream &stream) noexcept(false) :
	Header( H )
{
    Decode( stream, true );
}